

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-socket.c
# Opt level: O2

int lheader(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  ulong n;
  size_t len;
  
  iVar1 = 1;
  pcVar2 = luaL_checklstring(L,1,&len);
  if (len - 5 < 0xfffffffffffffffc) {
    iVar1 = luaL_error(L,"Invalid read %s",pcVar2);
  }
  else {
    n = 0;
    for (sVar3 = 0; len != sVar3; sVar3 = sVar3 + 1) {
      n = n << 8 | (ulong)(byte)pcVar2[sVar3];
    }
    lua_pushinteger(L,n);
  }
  return iVar1;
}

Assistant:

static int
lheader(lua_State *L) {
	size_t len;
	const uint8_t * s = (const uint8_t *)luaL_checklstring(L, 1, &len);
	if (len > 4 || len < 1) {
		return luaL_error(L, "Invalid read %s", s);
	}
	int i;
	size_t sz = 0;
	for (i=0;i<(int)len;i++) {
		sz <<= 8;
		sz |= s[i];
	}

	lua_pushinteger(L, (lua_Integer)sz);

	return 1;
}